

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicBinaryData>::copyInto
          (Property<Protocol::MQTT::Common::DynamicBinaryData> *this,uint8 *buffer)

{
  ushort uVar1;
  
  *buffer = (this->super_PropertyBase).type;
  uVar1 = *(ushort *)&this->field_0x21;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    else {
      uVar1 = 0;
    }
  }
  *(ushort *)(buffer + 1) = uVar1;
  memcpy(buffer + 3,*(void **)&this->field_0x23,(ulong)*(ushort *)&this->field_0x21);
  return *(ushort *)&this->field_0x21 + 3;
}

Assistant:

uint32 copyInto(uint8 * buffer) const { buffer[0] = type; uint32 o = value.copyInto(buffer+1); return o + 1; }